

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9ReachY(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  char *pcVar3;
  char *pcVar4;
  char *local_b0;
  Gia_ParLlb_t Pars;
  
  Llb_ManSetDefaultParams(&Pars);
  Pars.fCluster = 0;
  Pars.fReorder = 0;
  Pars.nBddMax = 100;
  Pars.nClusterMax = 500;
  local_b0 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_0025863e:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"BCFTLbcryzvwh");
    iVar2 = globalUtilOptind;
    switch(iVar1) {
    case 0x72:
      Pars.fReorder = Pars.fReorder ^ 1;
      goto LAB_0025863e;
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x78:
      goto switchD_00258698_caseD_73;
    case 0x76:
      Pars.fVerbose = Pars.fVerbose ^ 1;
      goto LAB_0025863e;
    case 0x77:
      Pars.fVeryVerbose._0_1_ = (byte)Pars.fVeryVerbose ^ 1;
      goto LAB_0025863e;
    case 0x79:
      Pars.fSkipOutCheck = Pars.fSkipOutCheck ^ 1;
      goto LAB_0025863e;
    case 0x7a:
      Pars.fSkipReach = Pars.fSkipReach ^ 1;
      goto LAB_0025863e;
    }
    if (iVar1 != 0x42) {
      if (iVar1 == 0x43) {
        if (globalUtilOptind < argc) {
          iVar1 = atoi(argv[globalUtilOptind]);
          Pars.nClusterMax = iVar1;
          goto LAB_0025874b;
        }
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
      }
      else if (iVar1 == 0x46) {
        if (globalUtilOptind < argc) {
          iVar1 = atoi(argv[globalUtilOptind]);
          Pars.nIterMax = iVar1;
          goto LAB_0025874b;
        }
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
      }
      else if (iVar1 == 0x4c) {
        if (globalUtilOptind < argc) {
          local_b0 = argv[globalUtilOptind];
          globalUtilOptind = globalUtilOptind + 1;
          goto LAB_0025863e;
        }
        pcVar4 = "Command line switch \"-L\" should be followed by a file name.\n";
      }
      else {
        if (iVar1 != 0x54) {
          if (iVar1 == 0x62) {
            Pars.fBackward = Pars.fBackward ^ 1;
          }
          else {
            if (iVar1 != 99) {
              if (iVar1 == -1) {
                p = pAbc->pGia;
                if (p != (Gia_Man_t *)0x0) {
                  if (p->nRegs != 0) {
                    pAig = Gia_ManToAigSimple(p);
                    iVar2 = Llb_Nonlin4CoreReach(pAig,&Pars);
                    pAbc->Status = iVar2;
                    pAbc->nFrames = Pars.iFrame;
                    Abc_FrameReplaceCex(pAbc,&pAig->pSeqModel);
                    if (local_b0 != (char *)0x0) {
                      Abc_NtkWriteLogFile(local_b0,pAbc->pCex,pAbc->Status,pAbc->nFrames,"&reachy");
                    }
                    Aig_ManStop(pAig);
                    return 0;
                  }
                  Abc_Print(-1,"Abc_CommandAbc9ReachN(): The current AIG has no latches.\n");
                  return 0;
                }
                pcVar4 = "Abc_CommandAbc9ReachN(): There is no AIG.\n";
                iVar2 = -1;
                goto LAB_00258983;
              }
              goto switchD_00258698_caseD_73;
            }
            Pars.fCluster = Pars.fCluster ^ 1;
          }
          goto LAB_0025863e;
        }
        if (globalUtilOptind < argc) {
          iVar1 = atoi(argv[globalUtilOptind]);
          Pars.TimeLimit = iVar1;
          goto LAB_0025874b;
        }
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
      }
LAB_00258824:
      Abc_Print(-1,pcVar4);
      goto switchD_00258698_caseD_73;
    }
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-B\" should be followed by an integer.\n";
      goto LAB_00258824;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nBddMax = iVar1;
LAB_0025874b:
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_00258698_caseD_73:
      iVar2 = -2;
      Abc_Print(-2,"usage: &reachy [-BCFT num] [-L file] [-bcryzvh]\n");
      Abc_Print(-2,"\t         model checking via BDD-based reachability (non-linear-QS-based)\n");
      Abc_Print(-2,"\t-B num : the max BDD size to introduce cut points [default = %d]\n",
                (ulong)(uint)Pars.nBddMax);
      Abc_Print(-2,"\t-C num : the max BDD size to reparameterize/cluster [default = %d]\n",
                (ulong)(uint)Pars.nClusterMax);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)(uint)Pars.nIterMax);
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)Pars.TimeLimit);
      pcVar4 = "no logging";
      if (local_b0 != (char *)0x0) {
        pcVar4 = local_b0;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar4);
      pcVar3 = "yes";
      pcVar4 = "yes";
      if (Pars.fBackward == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-b     : enable using backward enumeration [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fCluster == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : enable reparametrization clustering [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fReorder == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : enable additional BDD var reordering before image [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (Pars.fSkipOutCheck == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (Pars.fSkipReach == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-z     : skip reachability (run preparation phase only) [default = %s]\n",
                pcVar4);
      if (Pars.fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar3);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_00258983:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ReachY( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan;
    char * pLogFileName = NULL;
    int c;

    // set defaults
    Llb_ManSetDefaultParams( pPars );
    pPars->fCluster = 0;
    pPars->fReorder = 0;
    pPars->nBddMax     = 100;
    pPars->nClusterMax = 500;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "BCFTLbcryzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nClusterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nClusterMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'b':
            pPars->fBackward ^= 1;
            break;
        case 'c':
            pPars->fCluster ^= 1;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'z':
            pPars->fSkipReach ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachN(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachN(): The current AIG has no latches.\n" );
        return 0;
    }
/*
    if ( Gia_ManObjNum(pAbc->pGia) >= (1<<16) )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachN(): Currently cannot handle AIGs with more than %d objects.\n", (1<<16) );
        return 0;
    }
*/
    pMan          = Gia_ManToAigSimple( pAbc->pGia );
    pAbc->Status  = Llb_Nonlin4CoreReach( pMan, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pMan->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&reachy" );
    Aig_ManStop( pMan );
    return 0;

usage:
    Abc_Print( -2, "usage: &reachy [-BCFT num] [-L file] [-bcryzvh]\n" );
    Abc_Print( -2, "\t         model checking via BDD-based reachability (non-linear-QS-based)\n" );
    Abc_Print( -2, "\t-B num : the max BDD size to introduce cut points [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-C num : the max BDD size to reparameterize/cluster [default = %d]\n", pPars->nClusterMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-b     : enable using backward enumeration [default = %s]\n", pPars->fBackward? "yes": "no" );
    Abc_Print( -2, "\t-c     : enable reparametrization clustering [default = %s]\n", pPars->fCluster? "yes": "no" );
    Abc_Print( -2, "\t-r     : enable additional BDD var reordering before image [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-z     : skip reachability (run preparation phase only) [default = %s]\n", pPars->fSkipReach? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-w     : prints additional information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}